

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfRequestPub.c
# Opt level: O0

sbfRequestPub_conflict
sbfRequestPub_create
          (sbfTport tport,sbfQueue queue,char *topic,sbfRequestPubReadyCb readyCb,void *closure)

{
  uint uVar1;
  undefined8 uVar2;
  sbfLog psVar3;
  char *pcVar4;
  sbfPub psVar5;
  sbfSub psVar6;
  sbfRequestPubReadyCb in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  void *in_R8;
  int used;
  char replyTopic [255];
  char requestTopic [255];
  sbfRequestPub_conflict pub;
  char local_238 [8];
  sbfRequestPub_conflict in_stack_fffffffffffffdd0;
  char local_138 [256];
  sbfRequestPub_conflict local_38;
  void *local_30;
  sbfRequestPubReadyCb local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar1 = snprintf(local_138,0xff,"%s@request",in_RDX);
  if ((((-1 < (int)uVar1) && (uVar1 < 0xff)) &&
      (uVar1 = snprintf(local_238,0xff,"%s@reply",local_20), -1 < (int)uVar1)) && (uVar1 < 0xff)) {
    local_38 = (sbfRequestPub_conflict)sbfMemory_calloc(1,0x68);
    uVar2 = sbfTport_getMw(local_10);
    psVar3 = (sbfLog)sbfMw_getLog(uVar2);
    local_38->mLog = psVar3;
    pcVar4 = (char *)sbfMemory_strdup(local_20);
    local_38->mTopic = pcVar4;
    sbfLog_log(local_38->mLog,0,"creating request publisher %p: topic %s",local_38,local_20);
    local_38->mReadyCb = local_28;
    local_38->mClosure = local_30;
    sbfGuid_new(local_38->mLog,&local_38->mNext);
    (local_38->mRequests).rbh_root = (sbfRequestImpl *)0x0;
    psVar5 = (sbfPub)sbfPub_create(local_10,local_18,local_138,sbfRequestPubPubReadyCb,local_38);
    local_38->mPub = psVar5;
    if (local_38->mPub != (sbfPub)0x0) {
      psVar6 = (sbfSub)sbfSub_create(local_10,local_18,local_238,sbfRequestPubSubReadyCb,
                                     sbfRequestPubSubMessageCb,local_38);
      local_38->mSub = psVar6;
      if (local_38->mSub != (sbfSub)0x0) {
        return local_38;
      }
    }
    sbfRequestPub_destroy(in_stack_fffffffffffffdd0);
  }
  return (sbfRequestPub_conflict)0x0;
}

Assistant:

sbfRequestPub
sbfRequestPub_create (sbfTport tport,
                      sbfQueue queue,
                      const char* topic,
                      sbfRequestPubReadyCb readyCb,
                      void* closure)
{
    sbfRequestPub pub;
    char          requestTopic[SBF_TOPIC_SIZE_LIMIT];
    char          replyTopic[SBF_TOPIC_SIZE_LIMIT];
    int           used;

    used = snprintf (requestTopic, sizeof requestTopic, "%s@request", topic);
    if (used < 0 || (size_t)used >= sizeof requestTopic)
        return NULL;
    used = snprintf (replyTopic, sizeof replyTopic, "%s@reply", topic);
    if (used < 0 || (size_t)used >= sizeof replyTopic)
        return NULL;

    pub = xcalloc (1, sizeof *pub);
    pub->mLog = sbfMw_getLog (sbfTport_getMw (tport));
    pub->mTopic = xstrdup (topic);

    sbfLog_debug (pub->mLog,
                  "creating request publisher %p: topic %s",
                  pub,
                  topic);

    pub->mReadyCb = readyCb;
    pub->mClosure = closure;

    sbfGuid_new (pub->mLog, &pub->mNext);
    RB_INIT (&pub->mRequests);

    pub->mPub = sbfPub_create (tport,
                               queue,
                               requestTopic,
                               sbfRequestPubPubReadyCb,
                               pub);
    if (pub->mPub == NULL)
        goto fail;

    pub->mSub = sbfSub_create (tport,
                               queue,
                               replyTopic,
                               sbfRequestPubSubReadyCb,
                               sbfRequestPubSubMessageCb,
                               pub);
    if (pub->mSub == NULL)
        goto fail;

    return pub;

fail:
    sbfRequestPub_destroy (pub);
    return NULL;
}